

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.h
# Opt level: O2

int Abc_ObjMvVarNum(Abc_Obj_t *pObj)

{
  void *pvVar1;
  int *piVar2;
  int iVar3;
  
  pvVar1 = Abc_NtkMvVar(pObj->pNtk);
  iVar3 = 2;
  if (pvVar1 != (void *)0x0) {
    pvVar1 = Abc_ObjMvVar(pObj);
    if (pvVar1 != (void *)0x0) {
      piVar2 = (int *)Abc_ObjMvVar(pObj);
      iVar3 = *piVar2;
    }
  }
  return iVar3;
}

Assistant:

static inline int         Abc_ObjMvVarNum( Abc_Obj_t * pObj )           { return (Abc_NtkMvVar(pObj->pNtk) && Abc_ObjMvVar(pObj))? *((int*)Abc_ObjMvVar(pObj)) : 2; }